

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

bool fileExists(wstring *strFilename)

{
  char *__file;
  int iVar1;
  undefined1 local_c0 [4];
  int intStat;
  stat stFileInfo;
  string utf8;
  wstring *strFilename_local;
  
  convertWStringToUtf8((wstring *)(stFileInfo.__glibc_reserved + 2));
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_c0);
  std::__cxx11::string::~string((string *)(stFileInfo.__glibc_reserved + 2));
  return iVar1 == 0;
}

Assistant:

bool fileExists(const std::wstring& strFilename)
{
#ifdef _WIN32
	struct _stat stFileInfo;
	int intStat = _wstat(strFilename.c_str(),&stFileInfo);
#else
	std::string utf8 = convertWStringToUtf8(strFilename);
	struct stat stFileInfo;
	int intStat = stat(utf8.c_str(),&stFileInfo);
#endif

	return intStat == 0;
}